

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<google::protobuf::SingleArena_CopyConstructEmpty_Test>::
CreateTest(ParameterizedTestFactory<google::protobuf::SingleArena_CopyConstructEmpty_Test> *this)

{
  Test *this_00;
  ParameterizedTestFactory<google::protobuf::SingleArena_CopyConstructEmpty_Test> *this_local;
  
  WithParamInterface<bool>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x18);
  google::protobuf::SingleArena_CopyConstructEmpty_Test::SingleArena_CopyConstructEmpty_Test
            ((SingleArena_CopyConstructEmpty_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }